

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O3

void __thiscall
fill<128U,_29U,_buffer_layout_bfs>::operator()
          (fill<128U,_29U,_buffer_layout_bfs> *this,array<Stream,_128UL> *streams,uchar **buffer,
          array<unsigned_long,_128UL> *buffer_count)

{
  uchar *__s1;
  unsigned_long *puVar1;
  int iVar2;
  unsigned_long *puVar3;
  unsigned_long uVar4;
  uchar *__s2;
  unsigned_long uVar5;
  long lVar6;
  size_t __n;
  size_t sVar7;
  uchar **from0;
  fill<128U,_58U,_buffer_layout_bfs> local_5c;
  fill<128U,_59U,_buffer_layout_bfs> local_5b;
  fill<128U,_59U,_buffer_layout_bfs> local_5a;
  fill<128U,_58U,_buffer_layout_bfs> local_59;
  uchar **local_58;
  array<Stream,_128UL> *local_50;
  unsigned_long *local_48;
  unsigned_long *local_40;
  long local_38;
  
  puVar3 = buffer_count->_M_elems + 0x3a;
  local_48 = buffer_count->_M_elems + 0x3b;
  local_58 = buffer + 0x4ba5;
  sVar7 = 0;
  lVar6 = 0;
  local_50 = streams;
  local_40 = puVar3;
  do {
    uVar4 = *puVar3;
    if (uVar4 == 0) {
      fill<128U,_58U,_buffer_layout_bfs>::operator()(&local_59,local_50,buffer,buffer_count);
      uVar4 = buffer_count->_M_elems[0x3a];
      if (uVar4 == 0) {
        uVar4 = *local_48;
        __n = -lVar6;
        lVar6 = -sVar7;
        break;
      }
    }
    uVar5 = *local_48;
    local_38 = lVar6;
    if (uVar5 == 0) {
      fill<128U,_59U,_buffer_layout_bfs>::operator()(&local_5a,local_50,buffer,buffer_count);
      uVar4 = buffer_count->_M_elems[0x3a];
      uVar5 = buffer_count->_M_elems[0x3b];
      if (uVar5 == 0) {
        __n = -local_38;
        lVar6 = -sVar7;
        goto LAB_00159416;
      }
    }
    __s1 = buffer[0x5d78 - uVar4];
    if (__s1 == (uchar *)0x0) {
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5c,"int cmp(const unsigned char *, const unsigned char *)");
    }
    __s2 = buffer[0x5d80 - uVar5];
    if (__s2 == (uchar *)0x0) {
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5d,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar2 = strcmp((char *)__s1,(char *)__s2);
    puVar3 = local_40;
    puVar1 = local_48;
    if (iVar2 < 1) {
      __s2 = __s1;
      puVar1 = local_40;
      uVar5 = uVar4;
    }
    *puVar1 = uVar5 - 1;
    buffer[sVar7 + 0x4ba5] = __s2;
    check_input(local_58,sVar7);
    lVar6 = local_38 + -8;
    sVar7 = sVar7 + 1;
    if (sVar7 == 0x5a9) {
      buffer_count->_M_elems[0x1d] = 0x5a9;
      return;
    }
  } while( true );
  do {
    if (uVar4 == 0) {
      fill<128U,_59U,_buffer_layout_bfs>::operator()(&local_5b,local_50,buffer,buffer_count);
      uVar4 = buffer_count->_M_elems[0x3b];
      if (uVar4 == 0) goto LAB_0015948c;
    }
    *(uchar **)((long)buffer + __n + 0x25d28) = buffer[0x5d80 - uVar4];
    uVar4 = uVar4 - 1;
    *local_48 = uVar4;
    lVar6 = lVar6 + -1;
    __n = __n + 8;
  } while (__n != 0x2d48);
  goto LAB_00159471;
LAB_0015948c:
  from0 = (uchar **)((long)buffer + (0x28a70 - __n));
  sVar7 = -lVar6;
  memmove(buffer + lVar6 + 0x514e,local_58,__n);
  buffer_count->_M_elems[0x1d] = sVar7;
  goto LAB_001594c2;
  while( true ) {
    *(uchar **)((long)buffer + __n + 0x25d28) = buffer[0x5d78 - uVar4];
    uVar4 = uVar4 - 1;
    *local_40 = uVar4;
    lVar6 = lVar6 + -1;
    __n = __n + 8;
    if (__n == 0x2d48) break;
LAB_00159416:
    if (uVar4 == 0) {
      fill<128U,_58U,_buffer_layout_bfs>::operator()(&local_5c,local_50,buffer,buffer_count);
      uVar4 = buffer_count->_M_elems[0x3a];
      if (uVar4 == 0) goto LAB_0015948c;
    }
  }
LAB_00159471:
  buffer_count->_M_elems[0x1d] = 0x5a9;
  sVar7 = 0x5a9;
  from0 = local_58;
LAB_001594c2:
  check_input(from0,sVar7);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}